

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O1

void * duckdb_je_large_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                 tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  rtree_leaf_elm_t *prVar3;
  rtree_leaf_elm_t *prVar4;
  _Bool _Var5;
  uint binind;
  rtree_leaf_elm_t *prVar6;
  void *result;
  size_t alignment_00;
  void **ppvVar7;
  ulong uVar8;
  ulong uVar9;
  rtree_t *rtree;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_t *prVar12;
  edata_t *edata;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  bool bVar13;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar12 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar12);
  }
  else {
    prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar6 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar8 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&prVar12->cache[0].leafkey + uVar8);
  prVar3 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + uVar8);
  if (prVar3 == prVar6) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar6) {
    prVar4 = prVar12->l2_cache[0].leaf;
    prVar12->l2_cache[0].leafkey = (uintptr_t)prVar3;
    prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar6;
    puVar2[1] = (ulong)prVar4;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar10 = prVar12->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar6) {
      uVar9 = 0;
      bVar13 = false;
    }
    else {
      uVar8 = 1;
      prVar11 = prVar10;
      do {
        uVar9 = uVar8;
        bVar13 = 6 < uVar9;
        if (uVar9 == 7) goto LAB_00d01939;
        prVar10 = prVar11 + 1;
        prVar1 = prVar11 + 1;
        uVar8 = uVar9 + 1;
        prVar11 = prVar10;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar6);
      bVar13 = 6 < uVar9;
    }
    prVar4 = prVar10->leaf;
    prVar10->leafkey = prVar12->l2_cache[uVar9].leafkey;
    prVar10->leaf = prVar12->l2_cache[uVar9].leaf;
    prVar12->l2_cache[uVar9].leafkey = (uintptr_t)prVar3;
    prVar12->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar6;
    puVar2[1] = (ulong)prVar4;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_00d01939:
    if (bVar13) {
      prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,false)
      ;
    }
  }
  edata = (edata_t *)(((long)(prVar6->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  uVar8 = *(ulong *)((long)duckdb_je_sz_index2size_tab +
                    (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
  uVar9 = (ulong)zero;
  _Var5 = duckdb_je_large_ralloc_no_move(tsdn,edata,usize,usize,zero);
  if (!_Var5) {
    duckdb_je_hook_invoke_expand
              (hook_args->is_realloc ^ hook_expand_rallocx,ptr,uVar8,usize,(uintptr_t)ptr,
               hook_args->args);
    return edata->e_addr;
  }
  alignment_00 = 0x40;
  if (0x40 < alignment) {
    alignment_00 = alignment;
  }
  result = duckdb_je_large_palloc(tsdn,arena,usize,alignment_00,zero);
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,result,(uintptr_t)result,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (uVar8 < usize) {
    usize = uVar8;
  }
  switchD_012dd528::default(result,edata->e_addr,usize);
  prVar12 = (rtree_ctx_t *)edata->e_addr;
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,prVar12,uVar8);
    return result;
  }
  if (uVar8 < 0x1001) {
    binind = (uint)duckdb_je_sz_size2index_tab[uVar8 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(uVar8);
  }
  if (binind < 0x24) {
    cache_bin = tcache->bins + binind;
    ppvVar7 = cache_bin->stack_head;
    if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar7) {
      if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small(tsdn,prVar12);
        return result;
      }
      duckdb_je_tcache_bin_flush_small
                (&tsdn->tsd,tcache,cache_bin,binind,
                 (uint)(tcache->bins[binind].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_00d01870:
      ppvVar7 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar7) {
        return result;
      }
      cache_bin->stack_head = ppvVar7 + -1;
      ppvVar7[-1] = prVar12;
      return result;
    }
LAB_00d0173f:
    cache_bin->stack_head = ppvVar7 + -1;
    ppvVar7[-1] = prVar12;
  }
  else {
    if (binind < tcache->tcache_slow->tcache_nbins) {
      ppvVar7 = tcache->bins[binind].stack_head;
      if (ppvVar7 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = tcache->bins + binind;
        if (tcache->bins[binind].low_bits_full == (uint16_t)ppvVar7) {
          duckdb_je_tcache_bin_flush_large
                    (&tsdn->tsd,tcache,cache_bin,binind,
                     (uint)(tcache->bins[binind].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          goto LAB_00d01870;
        }
        goto LAB_00d0173f;
      }
    }
    if (tsdn == (tsdn_t *)0x0) {
      rtree = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
    }
    else {
      rtree = (rtree_t *)
              &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,tsdn,rtree,prVar12,uVar9);
    duckdb_je_large_dalloc(tsdn,local_1c8.edata);
  }
  return result;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);

	size_t oldusize = edata_usize_get(edata);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, edata, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return edata_addr_get(edata);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, edata_addr_get(edata), copysize);
	isdalloct(tsdn, edata_addr_get(edata), oldusize, tcache, NULL, true);
	return ret;
}